

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void TestSerialize<EMBED_X509_EXTENSION*,EMBED_X509_EXTENSION*>
               (EMBED_X509_EXTENSION *obj,
               _func_int_EMBED_X509_EXTENSION_ptr_uint8_t_ptr_ptr *i2d_func,
               Span<const_unsigned_char> expected)

{
  allocator<unsigned_char> *this;
  Span<const_unsigned_char> span;
  Span<const_unsigned_char> span_00;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  size_type sVar4;
  uchar *puVar5;
  AssertHelper local_1e8;
  Message local_1e0;
  Span<const_unsigned_char> local_1d8;
  Bytes local_1c8;
  EMBED_X509_EXTENSION *local_1b8;
  uchar *puStack_1b0;
  Bytes local_1a8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_6;
  Message local_180;
  uchar *local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_5;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  undefined1 local_130 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar_2;
  Message local_c0;
  Bytes local_b8;
  EMBED_X509_EXTENSION *local_a8;
  uchar *local_a0;
  Bytes local_98;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  uchar *puStack_30;
  int len;
  uint8_t *ptr;
  _func_int_EMBED_X509_EXTENSION_ptr_uint8_t_ptr_ptr *i2d_func_local;
  EMBED_X509_EXTENSION *obj_local;
  Span<const_unsigned_char> expected_local;
  
  expected_local.data_ = (uchar *)expected.size_;
  obj_local = (EMBED_X509_EXTENSION *)expected.data_;
  puStack_30 = (uint8_t *)0x0;
  ptr = (uint8_t *)i2d_func;
  i2d_func_local = (_func_int_EMBED_X509_EXTENSION_ptr_uint8_t_ptr_ptr *)obj;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = (*i2d_func)(obj,&stack0xffffffffffffffd0);
  local_4c = 0;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)local_48,"len","0",
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    testing::Message::~Message(&local_58);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_a8 = obj_local;
    local_a0 = expected_local.data_;
    span_00.size_ = (size_t)expected_local.data_;
    span_00.data_ = (uchar *)obj_local;
    Bytes::Bytes(&local_98,span_00);
    Bytes::Bytes(&local_b8,puStack_30,
                 (long)gtest_ar.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_88,"Bytes(expected)","Bytes(ptr, len)",&local_98,&local_b8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_c0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x3a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    OPENSSL_free(puStack_30);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = (*(code *)ptr)(i2d_func_local,0);
    local_dc = 0;
    testing::internal::CmpHelperGT<int,int>
              ((internal *)local_d8,"len","0",
               (int *)((long)&gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 4),&local_dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                 ,0x3e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_e8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      sVar3 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&obj_local);
      local_104 = (int)sVar3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_100,"len","static_cast<int>(expected.size())",
                 (int *)((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4),&local_104);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar1) {
        testing::Message::Message(&local_110);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x3f,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_110);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_110);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      sVar4 = (size_type)
              gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_;
      this = (allocator<unsigned_char> *)
             ((long)&gtest_ar_4.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7);
      std::allocator<unsigned_char>::allocator(this);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130,sVar4,this);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&gtest_ar_4.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      puStack_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = (*(code *)ptr)(i2d_func_local,&stack0xffffffffffffffd0);
      sVar3 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&obj_local);
      local_14c = (int)sVar3;
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_148,"len","static_cast<int>(expected.size())",
                 (int *)((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4),&local_14c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_158);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                   ,0x44,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_158);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
        local_178 = puVar5 + sVar4;
        testing::internal::EqHelper::Compare<unsigned_char_*,_unsigned_char_*,_nullptr>
                  ((EqHelper *)local_170,"ptr","buf.data() + buf.size()",&stack0xffffffffffffffd0,
                   &local_178);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
        if (!bVar1) {
          testing::Message::Message(&local_180);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x45,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_180);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_180);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
        local_1b8 = obj_local;
        puStack_1b0 = expected_local.data_;
        span.size_ = (size_t)expected_local.data_;
        span.data_ = (uchar *)obj_local;
        Bytes::Bytes(&local_1a8,span);
        bssl::Span<unsigned_char_const>::
        Span<std::vector<unsigned_char,std::allocator<unsigned_char>>,void,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Span<unsigned_char_const> *)&local_1d8,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
        Bytes::Bytes(&local_1c8,local_1d8);
        testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                  ((EqHelper *)local_198,"Bytes(expected)","Bytes(buf)",&local_1a8,&local_1c8);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
        if (!bVar1) {
          testing::Message::Message(&local_1e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1e8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/asn1_test.cc"
                     ,0x46,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
          testing::internal::AssertHelper::~AssertHelper(&local_1e8);
          testing::Message::~Message(&local_1e0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_130);
    }
  }
  return;
}

Assistant:

void TestSerialize(T obj, int (*i2d_func)(U a, uint8_t **pp),
                   bssl::Span<const uint8_t> expected) {
  static_assert(std::is_convertible<T, U>::value,
                "incompatible parameter to i2d_func");
  // Test the allocating version first. It is easiest to debug.
  uint8_t *ptr = nullptr;
  int len = i2d_func(obj, &ptr);
  ASSERT_GT(len, 0);
  EXPECT_EQ(Bytes(expected), Bytes(ptr, len));
  OPENSSL_free(ptr);

  len = i2d_func(obj, nullptr);
  ASSERT_GT(len, 0);
  EXPECT_EQ(len, static_cast<int>(expected.size()));

  std::vector<uint8_t> buf(len);
  ptr = buf.data();
  len = i2d_func(obj, &ptr);
  ASSERT_EQ(len, static_cast<int>(expected.size()));
  EXPECT_EQ(ptr, buf.data() + buf.size());
  EXPECT_EQ(Bytes(expected), Bytes(buf));
}